

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O3

size_t __thiscall QPDFEFStreamObjectHelper::getSize(QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  QPDFObjectHandle val;
  QPDFObjectHandle local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_30._M_pi = &local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"/Size","");
  getParam((QPDFEFStreamObjectHelper *)&local_40,(string *)this);
  if (local_30._M_pi != &local_20) {
    operator_delete(local_30._M_pi,(ulong)((long)(_func_int ***)local_20._vptr__Sp_counted_base + 1)
                   );
  }
  bVar1 = QPDFObjectHandle::isInteger(&local_40);
  if (bVar1) {
    uVar2 = QPDFObjectHandle::getUIntValueAsUInt(&local_40);
    sVar3 = (size_t)uVar2;
  }
  else {
    sVar3 = 0;
  }
  if ((element_type *)
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return sVar3;
}

Assistant:

size_t
QPDFEFStreamObjectHelper::getSize()
{
    auto val = getParam("/Size");
    if (val.isInteger()) {
        return QIntC::to_size(val.getUIntValueAsUInt());
    }
    return 0;
}